

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

double __thiscall
imrt::Plan::incremental_eval
          (Plan *this,Station *station,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  size_t in_RSI;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RDI;
  _List_node_base *p_Var1;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *unaff_retaddr;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_00000128;
  vector<double,_std::allocator<double>_> *in_stack_00000130;
  vector<double,_std::allocator<double>_> *in_stack_00000138;
  vector<double,_std::allocator<double>_> *in_stack_00000140;
  Station *in_stack_00000148;
  EvaluationFunction *in_stack_00000150;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__x;
  
  __x = in_RDI;
  p_Var1 = (_List_node_base *)
           EvaluationFunction::incremental_eval
                     (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
                      in_stack_00000130,in_stack_00000128);
  in_RDI[8].super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = p_Var1;
  in_RDI[3].super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node._M_size = in_RSI;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (unaff_retaddr,__x);
  return (double)in_RDI[8].
                 super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                 _M_impl._M_node.super__List_node_base._M_prev;
}

Assistant:

double Plan::incremental_eval (Station& station, list< pair< int, double > >& diff) {
    evaluation_fx = ev.incremental_eval(station, w, Zmin, Zmax, diff);
    last_changed = &station;
    last_diff = diff;
    return(evaluation_fx);
  }